

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  char cVar1;
  ImGuiTableColumn *pIVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int column_n;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar6 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
    uVar6 = 0;
  }
  lVar5 = uVar6 * 0x68;
  uVar7 = 0;
  uVar3 = 0;
  for (lVar9 = 0; lVar5 - lVar9 != 0; lVar9 = lVar9 + 0x68) {
    pIVar2 = (table->Columns).Data;
    bVar4 = (&pIVar2->SortOrder)[lVar9];
    if (bVar4 == 0xff) {
LAB_0015a025:
      bVar4 = 0xff;
    }
    else if ((&pIVar2->IsEnabled)[lVar9] == false) {
      (&pIVar2->SortOrder)[lVar9] = -1;
      goto LAB_0015a025;
    }
    uVar11 = 1L << (bVar4 & 0x3f);
    if (bVar4 == 0xff) {
      uVar11 = 0;
    }
    uVar7 = uVar7 | uVar11;
    uVar3 = uVar3 + (bVar4 != 0xff);
  }
  if (uVar3 < 2) {
    bVar12 = false;
  }
  else {
    bVar12 = (table->Flags & 0x4000000) == 0;
  }
  if (1L << ((byte)uVar3 & 0x3f) != uVar7 + 1 || bVar12) {
    uVar7 = 0;
    for (uVar8 = 0; uVar8 < uVar3; uVar8 = uVar8 + 1) {
      lVar9 = 0x56;
      uVar10 = 0xffffffff;
      for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        if ((uVar7 >> (uVar11 & 0x3f) & 1) == 0) {
          pIVar2 = (table->Columns).Data;
          cVar1 = *(char *)((long)&pIVar2->Flags + lVar9);
          if ((cVar1 != -1) && ((uVar10 == 0xffffffff || (cVar1 < pIVar2[(int)uVar10].SortOrder))))
          {
            uVar10 = (uint)uVar11;
          }
        }
        lVar9 = lVar9 + 0x68;
      }
      pIVar2 = (table->Columns).Data;
      pIVar2[(int)uVar10].SortOrder = (ImGuiTableColumnIdx)uVar8;
      if (bVar12) {
        uVar3 = 1;
        for (lVar9 = 0; lVar5 - lVar9 != 0; lVar9 = lVar9 + 0x68) {
          if ((ulong)uVar10 * 0x68 - lVar9 != 0) {
            (&pIVar2->SortOrder)[lVar9] = -1;
          }
        }
        goto LAB_0015a150;
      }
      uVar7 = uVar7 | 1L << ((ulong)uVar10 & 0x3f);
    }
  }
  if ((uVar3 == 0) && (uVar3 = 0, (table->Flags & 0x8000000) == 0)) {
    uVar3 = 0;
    for (lVar9 = 0; lVar5 - lVar9 != 0; lVar9 = lVar9 + 0x68) {
      pIVar2 = (table->Columns).Data;
      if (((&pIVar2->IsEnabled)[lVar9] == true) &&
         ((*(byte *)((long)&pIVar2->Flags + lVar9 + 1) & 1) == 0)) {
        (&pIVar2->SortOrder)[lVar9] = '\0';
        (&pIVar2->field_0x64)[lVar9] =
             (&pIVar2->field_0x64)[lVar9] & 0xfc | (&pIVar2->SortDirectionsAvailList)[lVar9] & 3;
        uVar3 = 1;
        break;
      }
    }
  }
LAB_0015a150:
  table->SortSpecsCount = (ImGuiTableColumnIdx)uVar3;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}